

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O0

void set_header_add(FIOBJ hash,FIOBJ name,FIOBJ value)

{
  FIOBJ FVar1;
  size_t sVar2;
  ulong local_38;
  size_t i;
  FIOBJ tmp;
  FIOBJ old;
  FIOBJ value_local;
  FIOBJ name_local;
  FIOBJ hash_local;
  
  FVar1 = fiobj_hash_replace(hash,name,value);
  if (FVar1 != 0) {
    if (value == 0) {
      fiobj_free(FVar1);
    }
    else {
      sVar2 = fiobj_type_is(FVar1,FIOBJ_T_ARRAY);
      tmp = FVar1;
      if (sVar2 == 0) {
        tmp = fiobj_ary_new();
        fiobj_ary_push(tmp,FVar1);
      }
      sVar2 = fiobj_type_is(value,FIOBJ_T_ARRAY);
      if (sVar2 == 0) {
        fiobj_ary_push(tmp,value);
        fiobj_hash_replace(hash,name,tmp);
      }
      else {
        for (local_38 = 0; sVar2 = fiobj_ary_count(value), local_38 < sVar2; local_38 = local_38 + 1
            ) {
          FVar1 = fiobj_ary_index(value,local_38);
          FVar1 = fiobj_dup(FVar1);
          fiobj_ary_push(tmp,FVar1);
        }
        fiobj_hash_set(hash,name,tmp);
      }
    }
  }
  return;
}

Assistant:

static inline void set_header_add(FIOBJ hash, FIOBJ name, FIOBJ value) {
  FIOBJ old = fiobj_hash_replace(hash, name, value);
  if (!old)
    return;
  if (!value) {
    fiobj_free(old);
    return;
  }
  if (!FIOBJ_TYPE_IS(old, FIOBJ_T_ARRAY)) {
    FIOBJ tmp = fiobj_ary_new();
    fiobj_ary_push(tmp, old);
    old = tmp;
  }
  if (FIOBJ_TYPE_IS(value, FIOBJ_T_ARRAY)) {
    for (size_t i = 0; i < fiobj_ary_count(value); ++i) {
      fiobj_ary_push(old, fiobj_dup(fiobj_ary_index(value, i)));
    }
    /* frees `value` */
    fiobj_hash_set(hash, name, old);
    return;
  }
  /* value will be owned by both hash and array */
  fiobj_ary_push(old, value);
  /* don't free `value` (leave in array) */
  fiobj_hash_replace(hash, name, old);
}